

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O1

void __thiscall sf2cute::SoundFont::SoundFont(SoundFont *this)

{
  (this->samples_).
  super__Vector_base<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->samples_).
  super__Vector_base<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->instruments_).
  super__Vector_base<std::shared_ptr<sf2cute::SFInstrument>,_std::allocator<std::shared_ptr<sf2cute::SFInstrument>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->instruments_).
  super__Vector_base<std::shared_ptr<sf2cute::SFInstrument>,_std::allocator<std::shared_ptr<sf2cute::SFInstrument>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->presets_).
  super__Vector_base<std::shared_ptr<sf2cute::SFPreset>,_std::allocator<std::shared_ptr<sf2cute::SFPreset>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->instruments_).
  super__Vector_base<std::shared_ptr<sf2cute::SFInstrument>,_std::allocator<std::shared_ptr<sf2cute::SFInstrument>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->presets_).
  super__Vector_base<std::shared_ptr<sf2cute::SFPreset>,_std::allocator<std::shared_ptr<sf2cute::SFPreset>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->presets_).
  super__Vector_base<std::shared_ptr<sf2cute::SFPreset>,_std::allocator<std::shared_ptr<sf2cute::SFPreset>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->samples_).
  super__Vector_base<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->sound_engine_)._M_dataplus._M_p = (pointer)&(this->sound_engine_).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->sound_engine_,"EMU8000","");
  (this->bank_name_)._M_dataplus._M_p = (pointer)&(this->bank_name_).field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&this->bank_name_,"Unnamed","");
  (this->rom_name_)._M_dataplus._M_p = (pointer)&(this->rom_name_).field_2;
  (this->rom_name_)._M_string_length = 0;
  (this->rom_name_).field_2._M_local_buf[0] = '\0';
  (this->rom_version_).major_version = 0;
  (this->rom_version_).minor_version = 0;
  this->has_rom_version_ = false;
  (this->creation_date_)._M_dataplus._M_p = (pointer)&(this->creation_date_).field_2;
  (this->creation_date_)._M_string_length = 0;
  (this->creation_date_).field_2._M_local_buf[0] = '\0';
  (this->engineers_)._M_dataplus._M_p = (pointer)&(this->engineers_).field_2;
  (this->engineers_)._M_string_length = 0;
  (this->engineers_).field_2._M_local_buf[0] = '\0';
  (this->product_)._M_dataplus._M_p = (pointer)&(this->product_).field_2;
  (this->product_)._M_string_length = 0;
  (this->product_).field_2._M_local_buf[0] = '\0';
  (this->copyright_)._M_dataplus._M_p = (pointer)&(this->copyright_).field_2;
  (this->copyright_)._M_string_length = 0;
  (this->copyright_).field_2._M_local_buf[0] = '\0';
  (this->comment_)._M_dataplus._M_p = (pointer)&(this->comment_).field_2;
  (this->comment_)._M_string_length = 0;
  (this->comment_).field_2._M_local_buf[0] = '\0';
  (this->software_)._M_dataplus._M_p = (pointer)&(this->software_).field_2;
  (this->software_)._M_string_length = 0;
  (this->software_).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

SoundFont::SoundFont() :
    sound_engine_(kDefaultTargetSoundEngine),
    bank_name_(kDefaultBankName),
    has_rom_version_(false) {
}